

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

uint __thiscall kj::_::BTreeImpl::split(BTreeImpl *this,Leaf *dst,uint dstPos,Leaf *src,uint srcPos)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  
  uVar1 = src->rows[6].i;
  uVar2 = *(undefined8 *)(src->rows + 0xc);
  *(undefined8 *)(dst->rows + 3) = *(undefined8 *)(src->rows + 10);
  *(undefined8 *)(dst->rows + 5) = uVar2;
  uVar2 = *(undefined8 *)(src->rows + 9);
  *(undefined8 *)dst->rows = *(undefined8 *)(src->rows + 7);
  *(undefined8 *)(dst->rows + 2) = uVar2;
  src->rows[10] = 0;
  src->rows[0xb] = 0;
  src->rows[0xc] = 0;
  src->rows[0xd] = 0;
  src->rows[7] = 0;
  src->rows[8] = 0;
  src->rows[9] = 0;
  src->rows[10] = 0;
  if ((ulong)src->next == 0) {
    this->endLeaf = dstPos;
    uVar3 = 0;
  }
  else {
    this->tree[src->next].field_0.freelist.zero[0] = dstPos;
    uVar3 = src->next;
  }
  dst->next = uVar3;
  dst->prev = srcPos;
  src->next = dstPos;
  return uVar1 - 1;
}

Assistant:

inline uint operator*() const { KJ_IREQUIRE(i != 0); return i - 1; }